

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Stress::anon_unknown_0::UniformCase::iterate(UniformCase *this)

{
  allocator<unsigned_short> *this_00;
  code *pcVar1;
  short sVar2;
  short sVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  reference pvVar9;
  reference pvVar10;
  TestLog *this_01;
  MessageBuilder *this_02;
  RenderContext *pRVar11;
  undefined4 extraout_var;
  uint *puVar13;
  PixelBufferAccess local_288;
  int local_260;
  undefined1 local_25c [4];
  int indexIndex;
  UVec4 uniformValue;
  deUint32 one;
  int y_2;
  int x_2;
  GLint specialLoc;
  GLint positionLoc;
  Functions *gl;
  int local_ac;
  int local_a8;
  int baseNdx;
  int y_1;
  int x_1;
  float local_98 [2];
  float local_90;
  float local_8c;
  float posY;
  float posX;
  int y;
  int x;
  Surface resultImage;
  undefined1 local_60 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  allocator<tcu::Vector<float,_4>_> local_31;
  undefined1 local_30 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> gridVertices;
  UniformCase *this_local;
  long lVar12;
  
  gridVertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_31);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_30,
             0x211,&local_31);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_31);
  this_00 = (allocator<unsigned_short> *)((long)&resultImage.m_pixels.m_cap + 7);
  std::allocator<unsigned_short>::allocator(this_00);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_60,0xb58,this_00);
  std::allocator<unsigned_short>::~allocator
            ((allocator<unsigned_short> *)((long)&resultImage.m_pixels.m_cap + 7));
  tcu::Surface::Surface((Surface *)&y,0x100,0x100);
  for (posX = 0.0; (int)posX < 0x17; posX = (float)((int)posX + 1)) {
    for (posY = 0.0; (int)posY < 0x17; posY = (float)((int)posY + 1)) {
      local_8c = (float)(int)posX / 22.0 + (float)(int)posX / 22.0 + -1.0;
      local_90 = (float)(int)posY / 22.0 + (float)(int)posY / 22.0 + -1.0;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&y_1,local_8c,local_90,0.0,1.0);
      pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_30,(long)((int)posX * 0x17 + (int)posY));
      *(undefined8 *)pvVar9->m_data = _y_1;
      *(float (*) [2])(pvVar9->m_data + 2) = local_98;
    }
  }
  for (baseNdx = 0; baseNdx < 0x16; baseNdx = baseNdx + 1) {
    for (local_a8 = 0; local_a8 < 0x16; local_a8 = local_a8 + 1) {
      local_ac = (baseNdx * 0x16 + local_a8) * 6;
      sVar3 = (short)baseNdx;
      sVar2 = (short)local_a8;
      pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_60,
                           (long)local_ac);
      *pvVar10 = sVar3 * 0x17 + sVar2;
      sVar3 = (short)baseNdx;
      sVar2 = (short)local_a8;
      pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_60,
                           (long)(local_ac + 1));
      *pvVar10 = (sVar3 + 1) * 0x17 + sVar2 + 1;
      sVar3 = (short)baseNdx;
      sVar2 = (short)local_a8;
      pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_60,
                           (long)(local_ac + 2));
      *pvVar10 = (sVar3 + 1) * 0x17 + sVar2;
      sVar3 = (short)baseNdx;
      sVar2 = (short)local_a8;
      pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_60,
                           (long)(local_ac + 3));
      *pvVar10 = sVar3 * 0x17 + sVar2;
      sVar3 = (short)baseNdx;
      sVar2 = (short)local_a8;
      pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_60,
                           (long)(local_ac + 4));
      *pvVar10 = (sVar3 + 1) * 0x17 + sVar2 + 1;
      sVar2 = (short)baseNdx;
      sVar3 = (short)local_a8;
      pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_60,
                           (long)(local_ac + 5));
      *pvVar10 = sVar2 * 0x17 + sVar3 + 1;
    }
  }
  this_01 = tcu::TestContext::getLog
                      ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&gl,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  this_02 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&gl,
                       (char (*) [100])
                       "Drawing a grid with the shader. Setting u_special for vertex each tile to (special, special, 1, 1)."
                      );
  tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&gl);
  pRVar11 = gles3::Context::getRenderContext((this->super_RenderCase).super_TestCase.m_context);
  iVar5 = (*pRVar11->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar5);
  pcVar1 = *(code **)(lVar12 + 0x780);
  dVar6 = glu::ShaderProgram::getProgram((this->super_RenderCase).m_program);
  uVar7 = (*pcVar1)(dVar6,"a_pos");
  pcVar1 = *(code **)(lVar12 + 0xb48);
  dVar6 = glu::ShaderProgram::getProgram((this->super_RenderCase).m_program);
  uVar8 = (*pcVar1)(dVar6,"u_special");
  (**(code **)(lVar12 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar12 + 0x188))(0x4000);
  (**(code **)(lVar12 + 0x1a00))(0,0,0x100);
  pcVar1 = *(code **)(lVar12 + 0x1680);
  dVar6 = glu::ShaderProgram::getProgram((this->super_RenderCase).m_program);
  (*pcVar1)(dVar6);
  pcVar1 = *(code **)(lVar12 + 0x19f0);
  pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_30,0);
  (*pcVar1)(uVar7,4,0x1406,0,0,pvVar9);
  (**(code **)(lVar12 + 0x610))(uVar7);
  for (one = 0; (int)one < 0x16; one = one + 1) {
    for (uniformValue.m_data[3] = 0; (int)uniformValue.m_data[3] < 0x16;
        uniformValue.m_data[3] = uniformValue.m_data[3] + 1) {
      uniformValue.m_data[2] = 0x3f800000;
      tcu::Vector<unsigned_int,_4>::Vector
                ((Vector<unsigned_int,_4> *)local_25c,
                 *(uint *)(Stress::(anonymous_namespace)::s_specialFloats + (long)(int)one * 4),
                 *(uint *)(Stress::(anonymous_namespace)::s_specialFloats +
                          (long)(int)uniformValue.m_data[3] * 4),0x3f800000,0x3f800000);
      local_260 = (one * 0x16 + uniformValue.m_data[3]) * 6;
      pcVar1 = *(code **)(lVar12 + 0x15a8);
      puVar13 = tcu::Vector<unsigned_int,_4>::getPtr((Vector<unsigned_int,_4> *)local_25c);
      (*pcVar1)(uVar8,1,puVar13);
      pcVar1 = *(code **)(lVar12 + 0x568);
      pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_60,
                           (long)local_260);
      (*pcVar1)(4,6,0x1403,pvVar10);
    }
  }
  (**(code **)(lVar12 + 0x518))(uVar7);
  (**(code **)(lVar12 + 0x1680))(0);
  (**(code **)(lVar12 + 0x648))();
  dVar6 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar6,"UniformCase::iterate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                  ,0x386);
  pRVar11 = gles3::Context::getRenderContext((this->super_RenderCase).super_TestCase.m_context);
  tcu::Surface::getAccess(&local_288,(Surface *)&y);
  glu::readPixels(pRVar11,0,0,&local_288);
  bVar4 = RenderCase::checkResultImage(&this->super_RenderCase,(Surface *)&y);
  if (bVar4) {
    bVar4 = RenderCase::drawTestPattern(&this->super_RenderCase,false);
    if (bVar4) {
      tcu::TestContext::setTestResult
                ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"test pattern failed");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"missing or invalid fragments");
  }
  tcu::Surface::~Surface((Surface *)&y);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_60);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_30);
  return STOP;
}

Assistant:

UniformCase::IterateResult UniformCase::iterate (void)
{
	// Create a [s_specialFloats] X [s_specialFloats] grid of tile with each tile having 2 [s_specialFloats] values
	// and calculate some basic operations with the floating point values. If all goes well, nothing special should happen

	std::vector<tcu::Vec4>	gridVertices	((DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1));
	std::vector<deUint16>	indices			(DE_LENGTH_OF_ARRAY(s_specialFloats) * DE_LENGTH_OF_ARRAY(s_specialFloats) * 6);
	tcu::Surface			resultImage		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// vertices
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats) + 1; ++x)
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats) + 1; ++y)
	{
		const float		posX	= (float)x / (float)DE_LENGTH_OF_ARRAY(s_specialFloats) * 2.0f - 1.0f; // map from [0, len(s_specialFloats) ] to [-1, 1]
		const float		posY	= (float)y / (float)DE_LENGTH_OF_ARRAY(s_specialFloats) * 2.0f - 1.0f;

		gridVertices[x * (DE_LENGTH_OF_ARRAY(s_specialFloats)+1) + y] = tcu::Vec4(posX, posY, 0.0f, 1.0f);
	}

	// tiles
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats); ++x)
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats); ++y)
	{
		const int baseNdx = (x * (DE_LENGTH_OF_ARRAY(s_specialFloats)) + y) * 6;

		indices[baseNdx + 0] = (deUint16)((x+0) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+0));
		indices[baseNdx + 1] = (deUint16)((x+1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+1));
		indices[baseNdx + 2] = (deUint16)((x+1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+0));

		indices[baseNdx + 3] = (deUint16)((x+0) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+0));
		indices[baseNdx + 4] = (deUint16)((x+1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+1));
		indices[baseNdx + 5] = (deUint16)((x+0) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+1));
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Drawing a grid with the shader. Setting u_special for vertex each tile to (special, special, 1, 1)." << tcu::TestLog::EndMessage;

	// Draw grid
	{
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const GLint				positionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_pos");
		const GLint				specialLoc	= gl.getUniformLocation(m_program->getProgram(), "u_special");

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(m_program->getProgram());

		gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &gridVertices[0]);
		gl.enableVertexAttribArray(positionLoc);

		for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats); ++x)
		for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats); ++y)
		{
			const deUint32		one				= 0x3F800000;
			const tcu::UVec4	uniformValue	= tcu::UVec4(s_specialFloats[x], s_specialFloats[y], one, one);
			const int			indexIndex		= (x * DE_LENGTH_OF_ARRAY(s_specialFloats) + y) * 6;

			gl.uniform4fv(specialLoc, 1, (const float*)uniformValue.getPtr());
			gl.drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, &indices[indexIndex]);
		}


		gl.disableVertexAttribArray(positionLoc);

		gl.useProgram(0);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "UniformCase::iterate");

		glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
	}

	// verify everywhere was drawn (all pixels have Green = 255)
	if (!checkResultImage(resultImage))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "missing or invalid fragments");
		return STOP;
	}

	// test drawing still works
	if (!drawTestPattern(false))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "test pattern failed");
		return STOP;
	}

	// all ok
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}